

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mycanvas.c
# Opt level: O3

void my_canvas_draw_config(t_my_canvas *x,_glist *glist)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  _glist *p_Var4;
  ulong uVar5;
  uint uVar6;
  t_atom fontatoms [3];
  char tag [128];
  
  p_Var4 = (x->x_gui).x_glist;
  uVar1 = p_Var4->gl_zoom;
  p_Var4 = glist_getcanvas(p_Var4);
  uVar2 = text_xpix((t_text *)x,glist);
  uVar3 = text_ypix((t_text *)x,glist);
  uVar6 = 0;
  if (1 < (int)uVar1) {
    uVar6 = uVar1;
  }
  fontatoms[0].a_type = A_SYMBOL;
  fontatoms[0].a_w.w_symbol = gensym((x->x_gui).x_font);
  fontatoms[1].a_type = A_FLOAT;
  fontatoms[1].a_w._0_4_ = (undefined4)(int)-((x->x_gui).x_fontsize * uVar1);
  fontatoms[2].a_type = A_SYMBOL;
  fontatoms[2].a_w.w_symbol = gensym(sys_fontweight);
  sprintf(tag,"%lxRECT",x);
  pdgui_vmess((char *)0x0,"crs iiii",p_Var4,"coords",tag,(ulong)uVar2,(ulong)uVar3,
              (ulong)(x->x_vis_w * uVar1 + uVar2),(ulong)(x->x_vis_h * uVar1 + uVar3));
  uVar5 = (ulong)(uint)(x->x_gui).x_bcol;
  pdgui_vmess((char *)0x0,"crs rk rk",p_Var4,"itemconfigure",tag,"-fill",uVar5,"-outline",uVar5);
  sprintf(tag,"%lxBASE",x);
  pdgui_vmess((char *)0x0,"crs iiii",p_Var4,"coords",tag,(ulong)(uVar2 + uVar6),
              (ulong)(uVar6 + uVar3),(ulong)((x->x_gui).x_w + uVar2 + uVar6),
              (ulong)((x->x_gui).x_h + uVar6 + uVar3));
  uVar5 = 0xff;
  if (((x->x_gui).x_fsf.field_0x3 & 1) == 0) {
    uVar5 = (ulong)(uint)(x->x_gui).x_bcol;
  }
  pdgui_vmess((char *)0x0,"crs ri rk",p_Var4,"itemconfigure",tag,"-width",(ulong)uVar1,"-outline",
              uVar5);
  sprintf(tag,"%lxLABEL",x);
  pdgui_vmess((char *)0x0,"crs ii",p_Var4,"coords",tag,(ulong)((x->x_gui).x_ldx * uVar1 + uVar2),
              (ulong)(uVar1 * (x->x_gui).x_ldy + uVar3));
  pdgui_vmess((char *)0x0,"crs rA rk",p_Var4,"itemconfigure",tag,"-font",3,fontatoms,"-fill",
              (ulong)(uint)(x->x_gui).x_lcol);
  iemgui_dolabel(x,&x->x_gui,(x->x_gui).x_lab,1);
  return;
}

Assistant:

static void my_canvas_draw_config(t_my_canvas* x, t_glist* glist)
{
    const int zoom = IEMGUI_ZOOM(x);
    t_canvas *canvas = glist_getcanvas(glist);
    int xpos = text_xpix(&x->x_gui.x_obj, glist);
    int ypos = text_ypix(&x->x_gui.x_obj, glist);
    int offset = (zoom > 1 ? zoom : 0); /* keep zoomed border inside visible area */
    char tag[128];
    t_atom fontatoms[3];
    SETSYMBOL(fontatoms+0, gensym(x->x_gui.x_font));
    SETFLOAT (fontatoms+1, -(x->x_gui.x_fontsize)*zoom);
    SETSYMBOL(fontatoms+2, gensym(sys_fontweight));

    sprintf(tag, "%lxRECT", x);
    pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
        xpos, ypos, xpos + x->x_vis_w * zoom, ypos + x->x_vis_h * zoom);
    pdgui_vmess(0, "crs rk rk", canvas, "itemconfigure", tag,
        "-fill", x->x_gui.x_bcol,
        "-outline", x->x_gui.x_bcol);

    sprintf(tag, "%lxBASE", x);
    pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
        xpos + offset, ypos + offset,
        xpos + offset + x->x_gui.x_w, ypos + offset + x->x_gui.x_h);
    pdgui_vmess(0, "crs ri rk", canvas, "itemconfigure", tag,
        "-width", zoom,
        "-outline", (x->x_gui.x_fsf.x_selected ? IEM_GUI_COLOR_SELECTED : x->x_gui.x_bcol));

    sprintf(tag, "%lxLABEL", x);
    pdgui_vmess(0, "crs ii", canvas, "coords", tag,
        xpos + x->x_gui.x_ldx * zoom,
        ypos + x->x_gui.x_ldy * zoom);
    pdgui_vmess(0, "crs rA rk", canvas, "itemconfigure", tag,
        "-font", 3, fontatoms,
        "-fill", x->x_gui.x_lcol);
    iemgui_dolabel(x, &x->x_gui, x->x_gui.x_lab, 1);
}